

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytesinkutil.cpp
# Opt level: O3

UBool icu_63::ByteSinkUtil::appendChange
                (uint8_t *s,uint8_t *limit,char16_t *s16,int32_t s16Length,ByteSink *sink,
                Edits *edits,UErrorCode *errorCode)

{
  UBool UVar1;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((long)limit - (long)s < 0x80000000) {
      UVar1 = appendChange((int32_t)((long)limit - (long)s),s16,s16Length,sink,edits,errorCode);
      return UVar1;
    }
    *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  return '\0';
}

Assistant:

UBool
ByteSinkUtil::appendChange(const uint8_t *s, const uint8_t *limit,
                           const char16_t *s16, int32_t s16Length,
                           ByteSink &sink, Edits *edits, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) { return FALSE; }
    if ((limit - s) > INT32_MAX) {
        errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return FALSE;
    }
    return appendChange((int32_t)(limit - s), s16, s16Length, sink, edits, errorCode);
}